

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

value_type * __thiscall
booster::match_results<const_char_*>::operator[]
          (value_type *__return_storage_ptr__,match_results<const_char_*> *this,int n)

{
  int iVar1;
  pointer ppVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->super_pair<const_char_*,_const_char_*>).first = (char *)0x0;
  (__return_storage_ptr__->super_pair<const_char_*,_const_char_*>).second = (char *)0x0;
  __return_storage_ptr__->matched = false;
  if ((-1 < n) &&
     (ppVar2 = (this->offsets_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
     n < (int)((ulong)((long)(this->offsets_).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3))) {
    iVar1 = ppVar2[(uint)n].first;
    if ((long)iVar1 != -1) {
      __return_storage_ptr__->matched = true;
      pcVar3 = this->begin_;
      (__return_storage_ptr__->super_pair<const_char_*,_const_char_*>).first = pcVar3 + iVar1;
      (__return_storage_ptr__->super_pair<const_char_*,_const_char_*>).second =
           pcVar3 + ppVar2[(uint)n].second;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

value_type operator[](int n) const
		{
			value_type r;
			if(n < 0 || n >= int(offsets_.size()))
				return r;
			if(offsets_[n].first == -1)
				return r;
			r.matched = true;
			r.first = begin_;
			r.second = begin_;
			std::advance(r.first,offsets_[n].first);
			std::advance(r.second,offsets_[n].second);
			return r;
		}